

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.h
# Opt level: O0

void StartGame(void)

{
  int iVar1;
  string local_78 [32];
  string local_58 [48];
  string local_28 [8];
  string key;
  
  selectionLevel[0] = false;
  selectionLevel[1] = false;
  selectionLevel[2] = false;
  selectionLevel[3] = false;
  selectionLevel[4] = false;
  std::__cxx11::string::string(local_28);
  do {
    while (Points < 0x191) {
      std::operator<<((ostream *)&std::cout,anon_var_dwarf_a2e);
      SelectLevel();
      TimeChoose();
      Flag = 1;
      while (Flag != 0 && Points < 0x191) {
        SetTask();
      }
    }
    selectionLevel[Token + -1] = true;
    PrintGameMenu();
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_a38);
    std::operator>>((istream *)&std::cin,local_28);
    std::__cxx11::string::string(local_58,local_28);
    InputCheck((string *)local_58);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::string(local_78,local_28);
    iVar1 = InputCheck((string *)local_78);
    std::__cxx11::string::~string(local_78);
    if (iVar1 == 99) {
      std::operator<<((ostream *)&std::cout,"GAME OVER\n");
    }
    Points = 0;
  } while( true );
}

Assistant:

void StartGame()
{
    selectionLevel[0] = false;
    selectionLevel[1] = false;
    selectionLevel[2] = false;
    selectionLevel[3] = false;
    selectionLevel[4] = false;
    string key;



    while (1) {
        while (Points <= 400) {
            cout << "Выбор уровня 1 - 5";
            SelectLevel();

            TimeChoose();
            Flag = 1;
            while ((Flag != 0) && (Points <= 400)) {
                SetTask();
            }
        }
        selectionLevel[Token - 1] = true;

        PrintGameMenu();
        cout << "Продолжишь или нет?Если да то введи любую кнопку ,если нет "
                "введи "
                "99\n";
        cin >> key;
        InputCheck(key);
        if(InputCheck(key)==99) {
            cout << "GAME OVER\n";
        }
        Points = 0;
    }

}